

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8decode(char *p,char *end,wchar_t *len)

{
  byte bVar1;
  uchar c;
  wchar_t *len_local;
  char *end_local;
  char *p_local;
  
  bVar1 = *p;
  if (bVar1 < 0x80) {
    if (len != (wchar_t *)0x0) {
      *len = L'\x01';
    }
    return (uint)bVar1;
  }
  if (bVar1 < 0xa0) {
    if (len != (wchar_t *)0x0) {
      *len = L'\x01';
    }
    return (uint)cp1252[(int)(bVar1 - 0x80)];
  }
  if ((0xc1 < bVar1) && (((end == (char *)0x0 || (p + 1 < end)) && (((int)p[1] & 0xc0U) == 0x80))))
  {
    if (bVar1 < 0xe0) {
      if (len != (wchar_t *)0x0) {
        *len = L'\x02';
      }
      return ((int)*p & 0x1fU) * 0x40 + ((int)p[1] & 0x3fU);
    }
    if (bVar1 == 0xe0) {
      if ((byte)p[1] < 0xa0) goto LAB_001fb64f;
    }
    else if (0xef < bVar1) {
      if (bVar1 == 0xf0) {
        if ((byte)p[1] < 0x90) goto LAB_001fb64f;
      }
      else if ((0xf3 < bVar1) && ((bVar1 != 0xf4 || (0x8f < (byte)p[1])))) goto LAB_001fb64f;
      if (((end == (char *)0x0) || (p + 3 < end)) &&
         ((((int)p[2] & 0xc0U) == 0x80 && (((int)p[3] & 0xc0U) == 0x80)))) {
        if (len != (wchar_t *)0x0) {
          *len = L'\x04';
        }
        return ((int)*p & 7U) * 0x40000 + ((int)p[1] & 0x3fU) * 0x1000 + ((int)p[2] & 0x3fU) * 0x40
               + ((int)p[3] & 0x3fU);
      }
      goto LAB_001fb64f;
    }
    if (((end == (char *)0x0) || (p + 2 < end)) && (((int)p[2] & 0xc0U) == 0x80)) {
      if (len != (wchar_t *)0x0) {
        *len = L'\x03';
      }
      return ((int)*p & 0xfU) * 0x1000 + ((int)p[1] & 0x3fU) * 0x40 + ((int)p[2] & 0x3fU);
    }
  }
LAB_001fb64f:
  if (len != (wchar_t *)0x0) {
    *len = L'\x01';
  }
  return (uint)bVar1;
}

Assistant:

unsigned fl_utf8decode(const char* p, const char* end, int* len)
{
  unsigned char c = *(const unsigned char*)p;
  if (c < 0x80) {
    if (len) *len = 1;
    return c;
#if ERRORS_TO_CP1252
  } else if (c < 0xa0) {
    if (len) *len = 1;
    return cp1252[c-0x80];
#endif
  } else if (c < 0xc2) {
    goto FAIL;
  }
  if ( (end && p+1 >= end) || (p[1]&0xc0) != 0x80) goto FAIL;
  if (c < 0xe0) {
    if (len) *len = 2;
    return
      ((p[0] & 0x1f) << 6) +
      ((p[1] & 0x3f));
  } else if (c == 0xe0) {
    if (((const unsigned char*)p)[1] < 0xa0) goto FAIL;
    goto UTF8_3;
#if STRICT_RFC3629
  } else if (c == 0xed) {
    /* RFC 3629 says surrogate chars are illegal. */
    if (((const unsigned char*)p)[1] >= 0xa0) goto FAIL;
    goto UTF8_3;
  } else if (c == 0xef) {
    /* 0xfffe and 0xffff are also illegal characters */
    if (((const unsigned char*)p)[1]==0xbf &&
	((const unsigned char*)p)[2]>=0xbe) goto FAIL;
    goto UTF8_3;
#endif
  } else if (c < 0xf0) {
  UTF8_3:
    if ( (end && p+2 >= end) || (p[2]&0xc0) != 0x80) goto FAIL;
    if (len) *len = 3;
    return
      ((p[0] & 0x0f) << 12) +
      ((p[1] & 0x3f) << 6) +
      ((p[2] & 0x3f));
  } else if (c == 0xf0) {
    if (((const unsigned char*)p)[1] < 0x90) goto FAIL;
    goto UTF8_4;
  } else if (c < 0xf4) {
  UTF8_4:
    if ( (end && p+3 >= end) || (p[2]&0xc0) != 0x80 || (p[3]&0xc0) != 0x80) goto FAIL;
    if (len) *len = 4;
#if STRICT_RFC3629
    /* RFC 3629 says all codes ending in fffe or ffff are illegal: */
    if ((p[1]&0xf)==0xf &&
	((const unsigned char*)p)[2] == 0xbf &&
	((const unsigned char*)p)[3] >= 0xbe) goto FAIL;
#endif
    return
      ((p[0] & 0x07) << 18) +
      ((p[1] & 0x3f) << 12) +
      ((p[2] & 0x3f) << 6) +
      ((p[3] & 0x3f));
  } else if (c == 0xf4) {
    if (((const unsigned char*)p)[1] > 0x8f) goto FAIL; /* after 0x10ffff */
    goto UTF8_4;
  } else {
  FAIL:
    if (len) *len = 1;
#if ERRORS_TO_ISO8859_1
    return c;
#else
    return 0xfffd; /* Unicode REPLACEMENT CHARACTER */
#endif
  }
}